

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsm.hpp
# Opt level: O0

void remora::bindings::
     trsm_block<32ul,16ul,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *param_1,
               matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2)

{
  double dVar1;
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> *this;
  double *pdVar2;
  dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag> *this_00;
  size_type sVar3;
  reference pdVar4;
  invalid_argument *this_01;
  size_t j_1;
  size_t i_1;
  size_t k;
  size_t j;
  size_t i;
  value_type blockA [32] [32];
  size_t size;
  matrix_element<const_double,_remora::row_major> A_elem;
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffdf70;
  double in_stack_ffffffffffffdf78;
  dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffdf80;
  size_t in_stack_ffffffffffffdf88;
  size_type sVar5;
  matrix_element<const_double,_remora::row_major> *in_stack_ffffffffffffdf90;
  size_type local_2060;
  size_type local_2058;
  size_type local_2050;
  ulong local_2048;
  ulong local_2040;
  double local_2038 [1025];
  size_type local_30;
  dense_matrix_storage<const_double,_remora::dense_tag> local_28;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_18;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  ::operator()(param_1);
  local_28 = (dense_matrix_storage<const_double,_remora::dense_tag>)
             dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
             ::elements(in_stack_ffffffffffffdf70);
  this = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(local_10);
  local_30 = dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
             ::size1(this);
  for (local_2040 = 0; local_2040 != local_30; local_2040 = local_2040 + 1) {
    for (local_2048 = 0; local_2048 <= local_2040; local_2048 = local_2048 + 1) {
      pdVar2 = device_traits<remora::cpu_tag>::matrix_element<const_double,_remora::row_major>::
               operator()(in_stack_ffffffffffffdf90,in_stack_ffffffffffffdf88,
                          (size_t)in_stack_ffffffffffffdf80);
      local_2038[local_2040 * 0x20 + local_2048] = *pdVar2;
    }
  }
  local_2050 = 0;
  do {
    sVar5 = local_2050;
    this_00 = matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              ::operator()(local_18);
    sVar3 = dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>::
            size2(this_00);
    if (sVar5 == sVar3) {
      return;
    }
    for (local_2058 = 0; local_2058 != local_30; local_2058 = local_2058 + 1) {
      for (local_2060 = 0; local_2060 != local_2058; local_2060 = local_2060 + 1) {
        in_stack_ffffffffffffdf78 = local_2038[local_2058 * 0x20 + local_2060];
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(local_18);
        pdVar4 = dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffdf80,(size_type)in_stack_ffffffffffffdf78,
                              (size_type)in_stack_ffffffffffffdf70);
        in_stack_ffffffffffffdf80 =
             (dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
              *)*pdVar4;
        matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
        ::operator()(local_18);
        pdVar4 = dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
                 ::operator()(in_stack_ffffffffffffdf80,(size_type)in_stack_ffffffffffffdf78,
                              (size_type)in_stack_ffffffffffffdf70);
        *pdVar4 = -in_stack_ffffffffffffdf78 * (double)in_stack_ffffffffffffdf80 + *pdVar4;
      }
      if ((local_2038[local_2058 * 0x21] == 0.0) && (!NAN(local_2038[local_2058 * 0x21]))) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_01,"[TRSM] Matrix is singular!");
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      dVar1 = local_2038[local_2058 * 0x21];
      matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
      ::operator()(local_18);
      pdVar4 = dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>
               ::operator()(in_stack_ffffffffffffdf80,(size_type)in_stack_ffffffffffffdf78,
                            (size_type)in_stack_ffffffffffffdf70);
      *pdVar4 = *pdVar4 / dVar1;
    }
    local_2050 = local_2050 + 1;
  } while( true );
}

Assistant:

void trsm_block(
	matrix_expression<MatA, cpu_tag> const& A,
	matrix_expression<MatB, cpu_tag>& B,
	lower,
	column_major // B is column-major
) {
	typedef typename MatA::value_type value_type;
	auto A_elem = A().elements();
	//evaluate and copy block of A
	std::size_t size = A().size1();
	value_type blockA[maxBlockSize1][maxBlockSize1];
	for(std::size_t i = 0; i != size; ++i){
		for(std::size_t j = 0; j <= i; ++j){
			blockA[i][j] = A_elem(i,j);
		}
	}

	//compute trsv kernel for each column in B
	for(std::size_t k = 0; k != B().size2(); ++k){
		for (std::size_t i = 0; i != size; ++i) {
			for (std::size_t j = 0; j != i; ++j) {
				B()(i,k) -= blockA[i][j] * B()(j,k);
			}
			if(!Unit){
				if(blockA[i][i] == value_type())
					throw std::invalid_argument("[TRSM] Matrix is singular!");
				B()(i,k) /= blockA[i][i];
			}
		}
	}
}